

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O3

void analogies(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *args)

{
  int iVar1;
  pointer pbVar2;
  element_type *__nptr;
  pointer pcVar3;
  int iVar4;
  int *piVar5;
  ostream *poVar6;
  invalid_argument *this;
  long lVar7;
  string prompt;
  string model;
  string wordB;
  string wordA;
  string wordC;
  FastText fasttext;
  char *local_170;
  long local_168;
  char local_160 [16];
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d0;
  FastText local_b8;
  
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar7 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5;
  if (lVar7 != 3) {
    if (lVar7 != 4) {
      printAnalogiesUsage();
      exit(1);
    }
    __nptr = (element_type *)pbVar2[3]._M_dataplus._M_p;
    piVar5 = __errno_location();
    iVar1 = *piVar5;
    *piVar5 = 0;
    lVar7 = strtol((char *)__nptr,(char **)&local_b8,10);
    if (local_b8.args_.super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        __nptr) {
      iVar4 = *piVar5;
      if ((int)lVar7 != lVar7 || iVar4 == 0x22) {
        iVar4 = std::__throw_out_of_range("stoi");
      }
      if (iVar4 == 0) {
        *piVar5 = iVar1;
      }
      if ((int)lVar7 < 1) {
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this,"k needs to be 1 or higher!");
        __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
      }
      goto LAB_00136d76;
    }
    std::__throw_invalid_argument("stoi");
  }
  lVar7 = 10;
LAB_00136d76:
  ::fasttext::FastText::FastText(&local_b8);
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  pcVar3 = pbVar2[2]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_150,pcVar3,pcVar3 + pbVar2[2]._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Loading model ",0xe);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_150._M_dataplus._M_p,local_150._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  ::fasttext::FastText::loadModel(&local_b8,&local_150);
  local_170 = local_160;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_170,"Query triplet (A - B + C)? ","");
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  local_110._M_string_length = 0;
  local_110.field_2._M_local_buf[0] = '\0';
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  local_130._M_string_length = 0;
  local_130.field_2._M_local_buf[0] = '\0';
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  local_f0._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_170,local_168);
  do {
    std::operator>>((istream *)&std::cin,(string *)&local_110);
    std::operator>>((istream *)&std::cin,(string *)&local_130);
    std::operator>>((istream *)&std::cin,(string *)&local_f0);
    ::fasttext::FastText::getAnalogies
              (&local_d0,&local_b8,(int32_t)lVar7,&local_110,&local_130,&local_f0);
    printPredictions(&local_d0,true,true);
    std::
    vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_d0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_170,local_168);
  } while( true );
}

Assistant:

void analogies(const std::vector<std::string> args) {
  int32_t k;
  if (args.size() == 3) {
    k = 10;
  } else if (args.size() == 4) {
    k = std::stoi(args[3]);
  } else {
    printAnalogiesUsage();
    exit(EXIT_FAILURE);
  }
  if (k <= 0) {
    throw std::invalid_argument("k needs to be 1 or higher!");
  }
  FastText fasttext;
  std::string model(args[2]);
  std::cout << "Loading model " << model << std::endl;
  fasttext.loadModel(model);

  std::string prompt("Query triplet (A - B + C)? ");
  std::string wordA, wordB, wordC;
  std::cout << prompt;
  while (true) {
    std::cin >> wordA;
    std::cin >> wordB;
    std::cin >> wordC;
    printPredictions(fasttext.getAnalogies(k, wordA, wordB, wordC), true, true);

    std::cout << prompt;
  }
  exit(0);
}